

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

OPTIONHANDLER_HANDLE retry_control_retrieve_options(RETRY_CONTROL_HANDLE retry_control_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  RETRY_CONTROL_INSTANCE *retry_control;
  LOGGER_LOG l_1;
  OPTIONHANDLER_HANDLE options;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  RETRY_CONTROL_HANDLE retry_control_handle_local;
  
  if (retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_retrieve_options",0x1d6,1,
                "Failed to retrieve options (retry_state_handle is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    handle = OptionHandler_Create
                       (retry_control_clone_option,retry_control_destroy_option,
                        retry_control_set_option);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"retry_control_retrieve_options",0x1df,1,
                  "Failed to retrieve options (OptionHandler_Create failed)");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      OVar1 = OptionHandler_AddOption
                        (handle,RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS,
                         &retry_control_handle->initial_wait_time_in_secs);
      if (OVar1 == OPTIONHANDLER_OK) {
        OVar1 = OptionHandler_AddOption
                          (handle,RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT,
                           &retry_control_handle->max_jitter_percent);
        l = (LOGGER_LOG)handle;
        if (OVar1 != OPTIONHANDLER_OK) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                      ,"retry_control_retrieve_options",0x1ed,1,
                      "Failed to retrieve options (OptionHandler_Create failed for option \'%s\')",
                      RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
          }
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                    ,"retry_control_retrieve_options",0x1e8,1,
                    "Failed to retrieve options (OptionHandler_Create failed for option \'%s\')",
                    RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
        }
        l = (LOGGER_LOG)0x0;
      }
      if (l == (LOGGER_LOG)0x0) {
        OptionHandler_Destroy(handle);
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

OPTIONHANDLER_HANDLE retry_control_retrieve_options(RETRY_CONTROL_HANDLE retry_control_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (retry_control_handle == NULL)
    {
        LogError("Failed to retrieve options (retry_state_handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(retry_control_clone_option, retry_control_destroy_option, (pfSetOption)retry_control_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

            if (OptionHandler_AddOption(options, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, (void*)&retry_control->initial_wait_time_in_secs) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options (OptionHandler_Create failed for option '%s')", RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
                result = NULL;
            }
            else if (OptionHandler_AddOption(options, RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, (void*)&retry_control->max_jitter_percent) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options (OptionHandler_Create failed for option '%s')", RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}